

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O2

void __thiscall
cbtIDebugDraw::drawCapsule
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar halfHeight,int upAxis,
          cbtTransform *transform,cbtVector3 *color)

{
  float fVar1;
  cbtScalar acVar2 [4];
  int iVar3;
  long lVar4;
  int i;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined8 uVar14;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar16 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  cbtVector3 cVar21;
  cbtVector3 local_d8;
  cbtVector3 center;
  cbtVector3 local_b8;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong uStack_80;
  cbtScalar local_78 [4];
  undefined8 local_68;
  undefined8 uStack_60;
  cbtVector3 axis;
  cbtVector3 up;
  undefined1 auVar20 [56];
  
  auVar17._4_60_ = in_register_00001244;
  auVar17._0_4_ = halfHeight;
  auVar20 = in_register_00001244._4_56_;
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar7 = vxorps_avx512vl(auVar17._0_16_,auVar7);
  lVar4 = (long)upAxis;
  local_b8.m_floats[0] = 0.0;
  local_b8.m_floats[1] = 0.0;
  local_b8.m_floats[2] = 0.0;
  local_b8.m_floats[3] = 0.0;
  local_d8.m_floats[0] = 0.0;
  local_d8.m_floats[1] = 0.0;
  local_d8.m_floats[2] = 0.0;
  local_d8.m_floats[3] = 0.0;
  local_d8.m_floats[lVar4] = halfHeight;
  local_b8.m_floats[lVar4] = auVar7._0_4_;
  local_a8._0_8_ = *(undefined8 *)(transform->m_basis).m_el[0].m_floats;
  local_a8._8_8_ = *(undefined8 *)((transform->m_basis).m_el[0].m_floats + 2);
  local_98 = *(undefined8 *)(transform->m_basis).m_el[1].m_floats;
  uStack_90 = *(undefined8 *)((transform->m_basis).m_el[1].m_floats + 2);
  local_88 = *(undefined8 *)(transform->m_basis).m_el[2].m_floats;
  uStack_80 = *(ulong *)((transform->m_basis).m_el[2].m_floats + 2);
  auVar15 = ZEXT856(uStack_80);
  cVar21 = cbtTransform::operator()(transform,&local_b8);
  auVar18._0_8_ = cVar21.m_floats._8_8_;
  auVar18._8_56_ = auVar20;
  auVar12._0_8_ = cVar21.m_floats._0_8_;
  auVar12._8_56_ = auVar15;
  center.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar12._0_16_,auVar18._0_16_);
  local_78[0] = center.m_floats[0];
  local_78[1] = center.m_floats[1];
  local_78[2] = center.m_floats[2];
  local_78[3] = center.m_floats[3];
  uVar5 = 0;
  lVar6 = (long)((upAxis + 1) % 3);
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(local_a8 + lVar6 * 4)),
                         ZEXT416(*(uint *)((long)&local_98 + lVar6 * 4)),0x10);
  acVar2 = (cbtScalar  [4])vmovlhps_avx(auVar7,ZEXT416(*(uint *)((long)&local_88 + lVar6 * 4)));
  up.m_floats[0] = acVar2[0];
  up.m_floats[1] = acVar2[1];
  up.m_floats[2] = acVar2[2];
  up.m_floats[3] = acVar2[3];
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(local_a8 + lVar4 * 4)),
                         ZEXT416(*(uint *)((long)&local_98 + lVar4 * 4)),0x10);
  auVar16._0_4_ = *(uint *)((long)&local_88 + lVar4 * 4) ^ 0x80000000;
  auVar16._4_4_ = 0x80000000;
  auVar16._8_4_ = 0x80000000;
  auVar16._12_4_ = 0x80000000;
  auVar9._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
  auVar9._8_4_ = auVar7._8_4_ ^ 0x80000000;
  auVar9._12_4_ = auVar7._12_4_ ^ 0x80000000;
  axis.m_floats = (cbtScalar  [4])vinsertps_avx(auVar9,auVar16,0x28);
  auVar20 = (undefined1  [56])0x0;
  (*this->_vptr_cbtIDebugDraw[0x12])
            ((ulong)(uint)radius,SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0x41f00000),0),this,&center,&up,&axis,color,0);
  local_a8 = *(undefined1 (*) [16])(transform->m_basis).m_el[0].m_floats;
  local_98 = *(undefined8 *)(transform->m_basis).m_el[1].m_floats;
  uStack_90 = *(undefined8 *)((transform->m_basis).m_el[1].m_floats + 2);
  local_88 = *(undefined8 *)(transform->m_basis).m_el[2].m_floats;
  uStack_80 = *(ulong *)((transform->m_basis).m_el[2].m_floats + 2);
  auVar15 = ZEXT856(uStack_80);
  cVar21 = cbtTransform::operator()(transform,&local_d8);
  auVar19._0_8_ = cVar21.m_floats._8_8_;
  auVar19._8_56_ = auVar20;
  auVar13._0_8_ = cVar21.m_floats._0_8_;
  auVar13._8_56_ = auVar15;
  center.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,auVar19._0_16_);
  local_78[0] = center.m_floats[0];
  local_78[1] = center.m_floats[1];
  local_78[2] = center.m_floats[2];
  local_78[3] = center.m_floats[3];
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(local_a8 + lVar6 * 4)),
                         ZEXT416(*(uint *)((long)&local_98 + lVar6 * 4)),0x10);
  acVar2 = (cbtScalar  [4])vmovlhps_avx(auVar7,ZEXT416(*(uint *)((long)&local_88 + lVar6 * 4)));
  up.m_floats[0] = acVar2[0];
  up.m_floats[1] = acVar2[1];
  up.m_floats[2] = acVar2[2];
  up.m_floats[3] = acVar2[3];
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(local_a8 + lVar4 * 4)),
                         ZEXT416(*(uint *)((long)&local_98 + lVar4 * 4)),0x10);
  axis.m_floats =
       (cbtScalar  [4])vmovlhps_avx(auVar7,ZEXT416(*(uint *)((long)&local_88 + lVar4 * 4)));
  (*this->_vptr_cbtIDebugDraw[0x12])
            ((ulong)(uint)radius,SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0xbfc90fdb),0),SUB648(ZEXT464(0x3fc90fdb),0),
             SUB648(ZEXT464(0x41f00000),0),this,&center,&up,&axis,color,0);
  local_68 = *(undefined8 *)(transform->m_origin).m_floats;
  fVar1 = (transform->m_origin).m_floats[2];
  uStack_60 = 0;
  iVar3 = (upAxis + 2) % 3;
  for (; uVar5 < 0x168; uVar5 = uVar5 + 0x1e) {
    fVar8 = sinf((float)(int)uVar5 * 0.017453292);
    local_b8.m_floats[lVar6] = fVar8 * radius;
    local_d8.m_floats[lVar6] = fVar8 * radius;
    fVar8 = cosf((float)(int)uVar5 * 0.017453292);
    uVar14 = 0;
    local_b8.m_floats[iVar3] = fVar8 * radius;
    local_d8.m_floats[iVar3] = fVar8 * radius;
    cVar21 = ::operator*(&transform->m_basis,&local_b8);
    auVar10._0_4_ = cVar21.m_floats[0] + (float)local_68;
    auVar10._4_4_ = cVar21.m_floats[1] + local_68._4_4_;
    auVar10._8_4_ = (float)uVar14 + (float)uStack_60;
    auVar10._12_4_ = (float)((ulong)uVar14 >> 0x20) + uStack_60._4_4_;
    local_a8 = vinsertps_avx(auVar10,ZEXT416((uint)(cVar21.m_floats[2] + fVar1)),0x28);
    uVar14 = local_a8._8_8_;
    cVar21 = ::operator*(&transform->m_basis,&local_d8);
    auVar11._0_4_ = cVar21.m_floats[0] + (float)local_68;
    auVar11._4_4_ = cVar21.m_floats[1] + local_68._4_4_;
    auVar11._8_4_ = (float)uVar14 + (float)uStack_60;
    auVar11._12_4_ = (float)((ulong)uVar14 >> 0x20) + uStack_60._4_4_;
    center.m_floats =
         (cbtScalar  [4])vinsertps_avx(auVar11,ZEXT416((uint)(cVar21.m_floats[2] + fVar1)),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,local_a8,&center,color);
  }
  return;
}

Assistant:

virtual void drawCapsule(cbtScalar radius, cbtScalar halfHeight, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		int stepDegrees = 30;

		cbtVector3 capStart(0.f, 0.f, 0.f);
		capStart[upAxis] = -halfHeight;

		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = halfHeight;

		// Draw the ends
		{
			cbtTransform childTransform = transform;
			childTransform.getOrigin() = transform * capStart;
			{
				cbtVector3 center = childTransform.getOrigin();
				cbtVector3 up = childTransform.getBasis().getColumn((upAxis + 1) % 3);
				cbtVector3 axis = -childTransform.getBasis().getColumn(upAxis);
				cbtScalar minTh = -SIMD_HALF_PI;
				cbtScalar maxTh = SIMD_HALF_PI;
				cbtScalar minPs = -SIMD_HALF_PI;
				cbtScalar maxPs = SIMD_HALF_PI;

				drawSpherePatch(center, up, axis, radius, minTh, maxTh, minPs, maxPs, color, cbtScalar(stepDegrees), false);
			}
		}

		{
			cbtTransform childTransform = transform;
			childTransform.getOrigin() = transform * capEnd;
			{
				cbtVector3 center = childTransform.getOrigin();
				cbtVector3 up = childTransform.getBasis().getColumn((upAxis + 1) % 3);
				cbtVector3 axis = childTransform.getBasis().getColumn(upAxis);
				cbtScalar minTh = -SIMD_HALF_PI;
				cbtScalar maxTh = SIMD_HALF_PI;
				cbtScalar minPs = -SIMD_HALF_PI;
				cbtScalar maxPs = SIMD_HALF_PI;
				drawSpherePatch(center, up, axis, radius, minTh, maxTh, minPs, maxPs, color, cbtScalar(stepDegrees), false);
			}
		}

		// Draw some additional lines
		cbtVector3 start = transform.getOrigin();

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = capStart[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = capStart[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * capStart, start + transform.getBasis() * capEnd, color);
		}
	}